

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O1

void Abc_SclMinsizePerform(SC_Lib *pLib,Abc_Ntk_t *p,int fUseMax,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  long *plVar5;
  int *piVar6;
  Vec_Int_t *__ptr;
  long lVar7;
  uint uVar8;
  SC_Lib *pLib_00;
  
  __ptr = Abc_SclFindMinAreas(pLib,fUseMax);
  pLib_00 = pLib;
  Abc_SclMioGates2SclGates(pLib,p);
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    ppvVar4 = pVVar3->pArray;
    lVar7 = 0;
    do {
      plVar5 = (long *)ppvVar4[lVar7];
      if ((((plVar5 != (long *)0x0) &&
           (uVar8 = *(uint *)((long)plVar5 + 0x14) & 0xf, pLib_00 = (SC_Lib *)(ulong)uVar8,
           uVar8 == 7)) && (*(int *)((long)plVar5 + 0x1c) != 0)) &&
         (((*(int *)((long)plVar5 + 0x1c) != 1 ||
           (pLib_00 = (SC_Lib *)*plVar5, *(int *)((long)&pLib_00->pName + 4) != 4)) ||
          (plVar5[7] != 0)))) {
        if (p->vGates->nSize <= lVar7) {
LAB_003ff865:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar6 = p->vGates->pArray;
        iVar1 = piVar6[lVar7];
        if (((long)iVar1 < 0) || (iVar2 = (pLib->vCells).nSize, iVar2 <= iVar1)) {
          __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclUtil.c"
                        ,0xd6,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
        }
        if (__ptr->nSize <= iVar1) goto LAB_003ff865;
        uVar8 = __ptr->pArray[iVar1];
        pLib_00 = (SC_Lib *)(ulong)uVar8;
        if (((int)uVar8 < 0) || (iVar2 <= (int)uVar8)) {
          __assert_fail("gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclUtil.c"
                        ,0xd8,"void Abc_SclMinsizePerform(SC_Lib *, Abc_Ntk_t *, int, int)");
        }
        piVar6[lVar7] = uVar8;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar3->nSize);
  }
  Abc_SclSclGates2MioGates(pLib_00,p);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr == (Vec_Int_t *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_SclMinsizePerform( SC_Lib * pLib, Abc_Ntk_t * p, int fUseMax, int fVerbose )
{
    Vec_Int_t * vMinCells;
    Abc_Obj_t * pObj;
    int i, gateId;
    vMinCells = Abc_SclFindMinAreas( pLib, fUseMax );
    Abc_SclMioGates2SclGates( pLib, p );
    Abc_NtkForEachNodeNotBarBuf1( p, pObj, i )
    {
        gateId = Vec_IntEntry( p->vGates, i );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        gateId = Vec_IntEntry( vMinCells, gateId );
        assert( gateId >= 0 && gateId < Vec_PtrSize(&pLib->vCells) );
        Vec_IntWriteEntry( p->vGates, i, gateId );
    }
    Abc_SclSclGates2MioGates( pLib, p );
    Vec_IntFree( vMinCells );
}